

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void leveldb::log::_Test_PartialLastIsIgnored::_RunIt(void)

{
  undefined1 local_98 [8];
  _Test_PartialLastIsIgnored t;
  
  _Test_PartialLastIsIgnored((_Test_PartialLastIsIgnored *)local_98);
  _Run((_Test_PartialLastIsIgnored *)local_98);
  ~_Test_PartialLastIsIgnored((_Test_PartialLastIsIgnored *)local_98);
  return;
}

Assistant:

TEST(LogTest, PartialLastIsIgnored) {
  Write(BigString("bar", kBlockSize));
  // Cause a bad record length in the LAST block.
  ShrinkSize(1);
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ("", ReportMessage());
  ASSERT_EQ(0, DroppedBytes());
}